

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Vec_Ptr_t * temporaryLtlStore(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  void *Entry;
  int local_2c;
  int i;
  char *pFormula;
  Vec_Ptr_t *tempStore;
  Abc_Ntk_t *pNtk_local;
  
  if ((pNtk == (Abc_Ntk_t *)0x0) || (iVar1 = Vec_PtrSize(pNtk->vLtlProperties), iVar1 < 1)) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Vec_PtrSize(pNtk->vLtlProperties);
    pNtk_local = (Abc_Ntk_t *)Vec_PtrAlloc(iVar1);
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vLtlProperties), local_2c < iVar1;
        local_2c = local_2c + 1) {
      Entry = Vec_PtrEntry(pNtk->vLtlProperties,local_2c);
      Vec_PtrPush((Vec_Ptr_t *)pNtk_local,Entry);
    }
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtk_local);
    iVar2 = Vec_PtrSize(pNtk->vLtlProperties);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                    ,199,"Vec_Ptr_t *temporaryLtlStore(Abc_Ntk_t *)");
    }
  }
  return (Vec_Ptr_t *)pNtk_local;
}

Assistant:

Vec_Ptr_t *temporaryLtlStore( Abc_Ntk_t *pNtk )
{
    Vec_Ptr_t *tempStore;
    char *pFormula;
    int i;

    if( pNtk && Vec_PtrSize( pNtk->vLtlProperties ) > 0 )
    {
        tempStore = Vec_PtrAlloc( Vec_PtrSize( pNtk->vLtlProperties ) );
        Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pFormula, i )
            Vec_PtrPush( tempStore, pFormula );
        assert( Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties ) );
        return tempStore;
    }
    else
        return NULL;
}